

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

string * __thiscall
flatbuffers::java::JavaGenerator::GenTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type,bool vectorelem,
          bool wrap_in_namespace)

{
  BaseType BVar1;
  char *pcVar2;
  pointer pcVar3;
  long *plVar4;
  EnumDef **ppEVar5;
  string new_type_name;
  Type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  DestinationType(&local_90,this,type,true);
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&local_90);
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_VECTOR < 2) {
LAB_0022afcf:
    if (type->struct_def == (StructDef *)0x0) {
      if (type->element != BASE_TYPE_UNION) goto LAB_0022b254;
      if (wrap_in_namespace) {
        IdlNamer::NamespacedType_abi_cxx11_
                  (&local_50,&this->namer_,&type->enum_def->super_Definition);
        std::operator+(&local_70,&this->package_prefix_,&local_50);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
        goto LAB_0022b0c9;
      }
      (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_70,&this->namer_,type->enum_def);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
LAB_0022b1cd:
      ppEVar5 = (EnumDef **)(plVar4 + 2);
      if ((EnumDef **)*plVar4 == ppEVar5) {
        local_90.enum_def = *ppEVar5;
        local_90._24_8_ = plVar4[3];
        local_90._0_8_ = &local_90.enum_def;
      }
      else {
        local_90.enum_def = *ppEVar5;
        local_90._0_8_ = (EnumDef **)*plVar4;
      }
      local_90.struct_def = (StructDef *)plVar4[1];
      *plVar4 = (long)ppEVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
      if ((EnumDef **)local_90._0_8_ != &local_90.enum_def) {
        operator_delete((void *)local_90._0_8_,
                        (ulong)((long)&((local_90.enum_def)->super_Definition).name._M_dataplus._M_p
                               + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0022b254;
    }
    else {
      pcVar2 = (char *)(type->struct_def->super_Definition).name._M_string_length;
      (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_90,&this->namer_);
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,
                 __return_storage_ptr__->_M_string_length - (long)pcVar2,pcVar2,local_90._0_8_);
      local_70.field_2._M_allocated_capacity = (size_type)local_90.enum_def;
      local_70._M_dataplus._M_p = (pointer)local_90._0_8_;
      if ((EnumDef **)local_90._0_8_ == &local_90.enum_def) goto LAB_0022b254;
    }
  }
  else {
    if (BVar1 != BASE_TYPE_UNION) {
      if (BVar1 != BASE_TYPE_ARRAY) goto LAB_0022b254;
      goto LAB_0022afcf;
    }
    if (!wrap_in_namespace) {
      (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_70,&this->namer_,type->enum_def);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      goto LAB_0022b1cd;
    }
    IdlNamer::NamespacedType_abi_cxx11_(&local_50,&this->namer_,&type->enum_def->super_Definition);
    std::operator+(&local_70,&this->package_prefix_,&local_50);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
LAB_0022b0c9:
    ppEVar5 = (EnumDef **)(plVar4 + 2);
    if ((EnumDef **)*plVar4 == ppEVar5) {
      local_90.enum_def = *ppEVar5;
      local_90._24_8_ = plVar4[3];
      local_90._0_8_ = &local_90.enum_def;
    }
    else {
      local_90.enum_def = *ppEVar5;
      local_90._0_8_ = (EnumDef **)*plVar4;
    }
    local_90.struct_def = (StructDef *)plVar4[1];
    *plVar4 = (long)ppEVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    if ((EnumDef **)local_90._0_8_ != &local_90.enum_def) {
      operator_delete((void *)local_90._0_8_,
                      (ulong)((long)&((local_90.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0022b254;
  }
  operator_delete(local_70._M_dataplus._M_p,
                  (ulong)((long)&(((EnumDef *)local_70.field_2._M_allocated_capacity)->
                                 super_Definition).name._M_dataplus._M_p + 1));
LAB_0022b254:
  if ((!vectorelem) &&
     ((type->base_type == BASE_TYPE_ARRAY || (type->base_type == BASE_TYPE_VECTOR)))) {
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_90._0_8_ = &local_90.enum_def;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    if ((EnumDef **)local_90._0_8_ != &local_90.enum_def) {
      operator_delete((void *)local_90._0_8_,
                      (ulong)((long)&((local_90.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet_ObjectAPI(const flatbuffers::Type &type,
                                   bool vectorelem,
                                   bool wrap_in_namespace) const {
    auto type_name = GenTypeNameDest(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name = namer_.ObjectType(*type.struct_def);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          if (wrap_in_namespace) {
            type_name =
                Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
          } else {
            type_name = namer_.Type(*type.enum_def) + "Union";
          }
        }
        break;
      }

      case BASE_TYPE_UNION: {
        if (wrap_in_namespace) {
          type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        } else {
          type_name = namer_.Type(*type.enum_def) + "Union";
        }
        break;
      }
      default: break;
    }
    if (vectorelem) { return type_name; }
    switch (type.base_type) {
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: {
        type_name = type_name + "[]";
        break;
      }
      default: break;
    }
    return type_name;
  }